

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall
QApplicationPrivate::activateImplicitTouchGrab
          (QApplicationPrivate *this,QWidget *widget,QTouchEvent *touchEvent,
          ImplicitTouchGrabMode grabMode)

{
  Type TVar1;
  QEventPoint *p;
  qsizetype qVar2;
  QObject *pQVar3;
  ulong uVar4;
  int in_ECX;
  QEvent *in_RDX;
  QEventPoint *ep;
  int i;
  QObject *in_stack_ffffffffffffffc8;
  int local_20;
  
  TVar1 = QEvent::type(in_RDX);
  if (TVar1 == TouchBegin) {
    local_20 = 0;
    while( true ) {
      p = (QEventPoint *)(long)local_20;
      qVar2 = QPointerEvent::pointCount((QPointerEvent *)0x2d3efd);
      if (qVar2 <= (long)p) break;
      QPointerEvent::point((longlong)in_RDX);
      pQVar3 = QMutableEventPoint::target((QEventPoint *)0x2d3f37);
      if ((pQVar3 == (QObject *)0x0) &&
         ((uVar4 = QEventPoint::isAccepted(), (uVar4 & 1) != 0 || (in_ECX == 1)))) {
        QMutableEventPoint::setTarget(p,in_stack_ffffffffffffffc8);
      }
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void QApplicationPrivate::activateImplicitTouchGrab(QWidget *widget, QTouchEvent *touchEvent,
                                                    ImplicitTouchGrabMode grabMode)
{
    if (touchEvent->type() != QEvent::TouchBegin)
        return;

    // If the widget dispatched the event further (see QGraphicsProxyWidget), then
    // there might already be an implicit grabber. Don't override that. A widget that
    // has partially recognized a gesture needs to grab all points.
    for (int i = 0; i < touchEvent->pointCount(); ++i) {
        auto &ep = touchEvent->point(i);
        if (!QMutableEventPoint::target(ep) && (ep.isAccepted() || grabMode == GrabAllPoints))
            QMutableEventPoint::setTarget(ep, widget);
    }
    // TODO setExclusiveGrabber() to be consistent with Qt Quick?
}